

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O1

void MemoryLeakWarningPlugin::destroyGlobalDetector(void)

{
  operator_new_fptr = normal_operator_new;
  operator_new_nothrow_fptr = normal_operator_new_nothrow;
  operator_new_debug_fptr = normal_operator_new_debug;
  operator_new_array_fptr = normal_operator_new_array;
  operator_new_array_nothrow_fptr = normal_operator_new_array_nothrow;
  operator_new_array_debug_fptr = normal_operator_new_array_debug;
  operator_delete_fptr = normal_operator_delete;
  operator_delete_array_fptr = normal_operator_delete_array;
  malloc_fptr = normal_malloc;
  realloc_fptr = normal_realloc;
  free_fptr = normal_free;
  if (globalDetector != (MemoryLeakDetector *)0x0) {
    (*globalDetector->_vptr_MemoryLeakDetector[1])();
  }
  if (globalReporter != (MemoryLeakFailure *)0x0) {
    (*globalReporter->_vptr_MemoryLeakFailure[1])();
  }
  globalDetector = (MemoryLeakDetector *)0x0;
  return;
}

Assistant:

void MemoryLeakWarningPlugin::destroyGlobalDetector()
{
    turnOffNewDeleteOverloads();
    delete globalDetector;
    delete globalReporter;
    globalDetector = NULLPTR;
}